

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(SessionHandle *data,connectdata **in_connect,_Bool *asyncp,
                     _Bool *protocol_done)

{
  undefined1 auVar1 [16];
  curl_proxytype cVar2;
  uint uVar3;
  void *pvVar4;
  connectdata *pcVar5;
  char cVar6;
  int iVar7;
  CURLcode CVar8;
  uchar *ch;
  connectdata *pcVar9;
  char *pcVar10;
  curl_llist *pcVar11;
  size_t sVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  ulong uVar17;
  CURLcode CVar18;
  Curl_handler *pCVar19;
  Curl_handler **ppCVar20;
  bool bVar21;
  _Bool _Var22;
  undefined1 auVar23 [16];
  timeval tVar24;
  connectdata *conn_temp;
  char protobuf [16];
  char passwd [256];
  char user [256];
  _Bool *local_288;
  connectdata *local_260;
  _Bool local_258 [16];
  ulong local_248;
  char *local_240;
  char local_238 [256];
  char local_138 [264];
  
  local_260 = (connectdata *)0x0;
  *asyncp = false;
  if ((data->change).url == (char *)0x0) {
LAB_0011d2fc:
    CVar8 = CURLE_URL_MALFORMAT;
    goto LAB_0011d302;
  }
  pcVar9 = (connectdata *)(*Curl_ccalloc)(1,0x590);
  CVar18 = CURLE_OUT_OF_MEMORY;
  CVar8 = CVar18;
  if (pcVar9 == (connectdata *)0x0) goto LAB_0011d302;
  pcVar9->handler = &Curl_handler_dummy;
  pcVar9->sock[0] = -1;
  pcVar9->sock[1] = -1;
  pcVar9->connectindex = -1;
  pcVar9->port = -1;
  (pcVar9->bits).close = true;
  tVar24 = curlx_tvnow();
  pcVar9->created = tVar24;
  pcVar9->data = data;
  cVar2 = (data->set).proxytype;
  pcVar9->proxytype = cVar2;
  pcVar10 = (data->set).str[0x10];
  if (pcVar10 == (char *)0x0) {
    (pcVar9->bits).proxy = false;
LAB_0011ce13:
    _Var22 = false;
  }
  else {
    bVar21 = *pcVar10 == '\0';
    (pcVar9->bits).proxy = !bVar21;
    if (bVar21) goto LAB_0011ce13;
    if (cVar2 == CURLPROXY_HTTP) {
      _Var22 = true;
    }
    else {
      _Var22 = cVar2 == CURLPROXY_HTTP_1_0;
    }
  }
  (pcVar9->bits).httpproxy = _Var22;
  (pcVar9->bits).proxy_user_passwd = (data->set).str[0x1e] != (char *)0x0;
  (pcVar9->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (pcVar9->bits).user_passwd = (data->set).str[0x1c] != (char *)0x0;
  (pcVar9->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (pcVar9->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  pcVar9->verifypeer = (data->set).ssl.verifypeer;
  pcVar9->verifyhost = (data->set).ssl.verifyhost;
  pcVar9->ip_version = (data->set).ipver;
  if (((data->multi == (Curl_multi *)0x0) || (_Var22 = Curl_multi_canPipeline(data->multi), !_Var22)
      ) || (pcVar9->master_buffer != (char *)0x0)) {
LAB_0011cebd:
    pcVar11 = Curl_llist_alloc(llist_dtor);
    pcVar9->send_pipe = pcVar11;
    pcVar11 = Curl_llist_alloc(llist_dtor);
    pcVar9->recv_pipe = pcVar11;
    pcVar11 = Curl_llist_alloc(llist_dtor);
    pcVar9->pend_pipe = pcVar11;
    pcVar11 = Curl_llist_alloc(llist_dtor);
    pcVar9->done_pipe = pcVar11;
    if (((pcVar9->send_pipe != (curl_llist *)0x0) && (pcVar9->recv_pipe != (curl_llist *)0x0)) &&
       (pcVar11 != (curl_llist *)0x0 && pcVar9->pend_pipe != (curl_llist *)0x0)) {
      pcVar10 = (data->set).str[5];
      if (pcVar10 != (char *)0x0) {
        pcVar10 = (*Curl_cstrdup)(pcVar10);
        pcVar9->localdev = pcVar10;
        if (pcVar10 == (char *)0x0) goto LAB_0011cf2d;
      }
      pcVar9->localportrange = (data->set).localportrange;
      pcVar9->localport = (data->set).localport;
      pvVar4 = (data->set).closesocket_client;
      pcVar9->fclosesocket = (data->set).fclosesocket;
      pcVar9->closesocket_client = pvVar4;
      *in_connect = pcVar9;
      sVar12 = strlen((data->change).url);
      sVar13 = 0x100;
      if (0x100 < sVar12) {
        sVar13 = sVar12;
      }
      pcVar10 = (data->state).pathbuffer;
      if (pcVar10 != (char *)0x0) {
        (*Curl_cfree)(pcVar10);
        (data->state).pathbuffer = (char *)0x0;
      }
      (data->state).path = (char *)0x0;
      pcVar10 = (char *)(*Curl_cmalloc)(sVar13 + 2);
      (data->state).pathbuffer = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_0011d302;
      (data->state).path = pcVar10;
      pcVar10 = (char *)(*Curl_cmalloc)(sVar13 + 2);
      (pcVar9->host).rawalloc = pcVar10;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = (data->state).pathbuffer;
        if (pcVar10 != (char *)0x0) {
          (*Curl_cfree)(pcVar10);
          (data->state).pathbuffer = (char *)0x0;
        }
        (data->state).path = (char *)0x0;
        goto LAB_0011d302;
      }
      (pcVar9->host).name = pcVar10;
      *pcVar10 = '\0';
      pcVar10 = (data->state).path;
      local_288 = local_258;
      iVar7 = __isoc99_sscanf((data->change).url,"%15[^:]:%[^\n]");
      if ((iVar7 == 2) && (iVar7 = Curl_raw_equal(local_258,"file"), iVar7 != 0)) {
        if (*pcVar10 == '/') {
          if (pcVar10[1] == '/') {
            sVar13 = strlen(pcVar10 + 2);
            memmove(pcVar10,pcVar10 + 2,sVar13 + 1);
            local_288 = (_Bool *)0x13d6b1;
            if (*pcVar10 == '/') {
              bVar21 = false;
              goto LAB_0011d23e;
            }
            goto LAB_0011d1fa;
          }
        }
        else {
LAB_0011d1fa:
          pcVar15 = strchr(pcVar10,0x2f);
          if (pcVar15 != (char *)0x0) {
            pcVar16 = pcVar15 + 1;
            if (pcVar15[1] != '/') {
              pcVar16 = pcVar15;
            }
            sVar13 = strlen(pcVar16);
            memmove(pcVar10,pcVar16,sVar13 + 1);
          }
        }
        bVar21 = false;
        local_288 = (_Bool *)0x13d6b1;
      }
      else {
        *pcVar10 = '\0';
        bVar21 = false;
        iVar7 = __isoc99_sscanf((data->change).url,"%15[^\n:]://%[^\n/?]%[^\n]",local_258);
        if (iVar7 < 2) {
          iVar7 = __isoc99_sscanf((data->change).url,"%[^\n/?]%[^\n]",(pcVar9->host).name);
          if (iVar7 < 1) {
            Curl_failf(data,"<url> malformed");
            goto LAB_0011d2fc;
          }
          iVar7 = Curl_raw_nequal("FTP.",(pcVar9->host).name,4);
          bVar21 = true;
          if (iVar7 == 0) {
            iVar7 = Curl_raw_nequal("DICT.",(pcVar9->host).name,5);
            if (iVar7 == 0) {
              iVar7 = Curl_raw_nequal("LDAP.",(pcVar9->host).name,5);
              if (iVar7 == 0) {
                iVar7 = Curl_raw_nequal("IMAP.",(pcVar9->host).name,5);
                local_288 = (_Bool *)0x13b672;
                if (iVar7 == 0) {
                  local_288 = (_Bool *)0x13b677;
                }
              }
              else {
                local_288 = (_Bool *)0x13b667;
              }
            }
            else {
              local_288 = (_Bool *)0x13b65c;
            }
          }
          else {
            local_288 = (_Bool *)0x13ba8c;
          }
        }
      }
LAB_0011d23e:
      pcVar15 = (pcVar9->host).name;
      pcVar14 = strchr(pcVar15,0x40);
      pcVar16 = pcVar14 + 1;
      if (pcVar14 == (char *)0x0) {
        pcVar16 = pcVar15;
      }
      pcVar15 = strchr(pcVar16,0x3f);
      if (pcVar15 == (char *)0x0) {
        cVar6 = *pcVar10;
        if (cVar6 != '\0') goto LAB_0011d2c6;
        pcVar10[0] = '/';
        pcVar10[1] = '\0';
      }
      else {
        sVar13 = strlen(pcVar15);
        sVar12 = strlen(pcVar10);
        memmove(pcVar10 + sVar13 + 1,pcVar10,sVar12 + 1);
        memcpy(pcVar10 + 1,pcVar15,sVar13);
        *pcVar10 = '/';
        *pcVar15 = '\0';
        cVar6 = *pcVar10;
LAB_0011d2c6:
        if (cVar6 == '?') {
          sVar13 = strlen(pcVar10);
          memmove(pcVar10 + 1,pcVar10,sVar13 + 1);
          *pcVar10 = '/';
        }
      }
      pcVar15 = (pcVar9->host).name;
      pcVar16 = strchr(pcVar15,0x40);
      local_138[0] = '\0';
      local_238[0] = '\0';
      if (pcVar16 != (char *)0x0) {
        (pcVar9->host).name = pcVar16 + 1;
        (pcVar9->bits).userpwd_in_url = true;
        if ((data->set).use_netrc != CURL_NETRC_REQUIRED) {
          (pcVar9->bits).user_passwd = true;
          if (*pcVar15 == ':') {
            __isoc99_sscanf(pcVar15,":%255[^@]",local_238);
          }
          else {
            __isoc99_sscanf(pcVar15,"%255[^:@]:%255[^@]",local_138);
          }
          if (local_138[0] != '\0') {
            pcVar15 = curl_easy_unescape(data,local_138,0,(int *)0x0);
            if (pcVar15 != (char *)0x0) {
              sVar13 = strlen(pcVar15);
              if (sVar13 < 0x100) {
                strcpy(local_138,pcVar15);
              }
              (*Curl_cfree)(pcVar15);
              goto LAB_0011d417;
            }
LAB_0011d688:
            CVar8 = CURLE_OUT_OF_MEMORY;
            goto LAB_0011d302;
          }
LAB_0011d417:
          if (local_238[0] != '\0') {
            pcVar15 = curl_easy_unescape(data,local_238,0,(int *)0x0);
            if (pcVar15 == (char *)0x0) goto LAB_0011d688;
            sVar13 = strlen(pcVar15);
            if (sVar13 < 0x100) {
              strcpy(local_238,pcVar15);
            }
            (*Curl_cfree)(pcVar15);
          }
        }
      }
      pcVar15 = (pcVar9->host).name;
      if ((*pcVar15 == '[') && (pcVar15 = strstr(pcVar15,"%25"), pcVar15 != (char *)0x0)) {
        uVar17 = strtoul(pcVar15 + 3,&local_240,10);
        if (*local_240 == ']') {
          local_248 = uVar17;
          sVar13 = strlen(local_240);
          memmove(pcVar15,local_240,sVar13 + 1);
          if ((data->state).this_is_a_follow == false) {
            pcVar9->scope = (uint)local_248;
          }
        }
        else {
          Curl_infof(data,"Invalid IPv6 address format\n");
        }
      }
      uVar3 = (data->set).scope;
      if (uVar3 != 0) {
        pcVar9->scope = uVar3;
      }
      pcVar10 = strchr(pcVar10,0x23);
      if (pcVar10 != (char *)0x0) {
        *pcVar10 = '\0';
        pcVar10 = strchr((data->change).url,0x23);
        if (pcVar10 != (char *)0x0) {
          *pcVar10 = '\0';
        }
      }
      pCVar19 = &Curl_handler_http;
      ppCVar20 = protocols;
      do {
        ppCVar20 = ppCVar20 + 1;
        iVar7 = Curl_raw_equal(pCVar19->scheme,local_288);
        if (iVar7 != 0) {
          if ((((uint)(data->set).allowed_protocols & pCVar19->protocol) != 0) &&
             (((data->state).this_is_a_follow != true ||
              (((uint)(data->set).redir_protocols & pCVar19->protocol) != 0)))) {
            pcVar9->given = pCVar19;
            pcVar9->handler = pCVar19;
            if (bVar21) {
              pcVar10 = curl_maprintf("%s://%s",pCVar19->scheme,(data->change).url);
              if (pcVar10 == (char *)0x0) goto LAB_0011d302;
              if (((data->change).url_alloc == true) &&
                 (pcVar15 = (data->change).url, pcVar15 != (char *)0x0)) {
                (*Curl_cfree)(pcVar15);
              }
              (data->change).url = pcVar10;
              (data->change).url_alloc = true;
              pCVar19 = pcVar9->given;
            }
            if (((pCVar19->flags & 0x40) != 0) &&
               (pcVar10 = strchr((pcVar9->data->state).path,0x3f), pcVar10 != (char *)0x0)) {
              *pcVar10 = '\0';
            }
            if (((pcVar9->bits).proxy_user_passwd == true) &&
               (CVar8 = parse_proxy_auth(data,pcVar9), CVar8 != CURLE_OK)) goto LAB_0011d302;
            pcVar10 = (data->set).str[0x10];
            if (pcVar10 == (char *)0x0) {
              pcVar10 = (char *)0x0;
            }
            else {
              pcVar10 = (*Curl_cstrdup)(pcVar10);
              if (pcVar10 == (char *)0x0) {
                Curl_failf(data,"memory shortage");
                CVar8 = CVar18;
                goto LAB_0011d302;
              }
            }
            pcVar15 = (data->set).str[0x20];
            if ((pcVar15 == (char *)0x0) ||
               (_Var22 = check_noproxy((pcVar9->host).name,pcVar15), !_Var22)) {
              if ((pcVar10 == (char *)0x0) &&
                 (pcVar10 = detect_proxy(pcVar9), pcVar10 == (char *)0x0)) goto LAB_0011d78a;
              if ((*pcVar10 == '\0') || ((pcVar9->handler->flags & 0x10) != 0)) goto LAB_0011d77e;
              CVar8 = parse_proxy(data,pcVar9,pcVar10);
              (*Curl_cfree)(pcVar10);
              if (CVar8 != CURLE_OK) goto LAB_0011d302;
              if (pcVar9->proxytype < 2) {
                _Var22 = true;
                if (((pcVar9->handler->protocol & 1) == 0) && ((pcVar9->bits).tunnel_proxy == false)
                   ) {
                  pcVar9->handler = &Curl_handler_http;
                }
              }
              else {
                _Var22 = false;
              }
              (pcVar9->bits).httpproxy = _Var22;
              (pcVar9->bits).proxy = true;
              CVar8 = setup_connection_internals(pcVar9);
              if (CVar8 != CURLE_OK) {
                (*Curl_cfree)(pcVar10);
                goto LAB_0011d302;
              }
            }
            else {
              if (pcVar10 != (char *)0x0) {
LAB_0011d77e:
                (*Curl_cfree)(pcVar10);
              }
LAB_0011d78a:
              (pcVar9->bits).proxy = false;
              (pcVar9->bits).httpproxy = false;
              (pcVar9->bits).proxy_user_passwd = false;
              (pcVar9->bits).tunnel_proxy = false;
              CVar8 = setup_connection_internals(pcVar9);
              if (CVar8 != CURLE_OK) goto LAB_0011d302;
            }
            pcVar9->recv[0] = Curl_recv_plain;
            pcVar9->send[0] = Curl_send_plain;
            pcVar9->recv[1] = Curl_recv_plain;
            pcVar9->send[1] = Curl_send_plain;
            if ((pcVar9->handler->flags & 0x10) != 0) {
              CVar8 = (*pcVar9->handler->connect_it)(pcVar9,local_258);
              if (CVar8 == CURLE_OK) {
                pcVar9->data = data;
                (pcVar9->bits).tcpconnect[0] = true;
                ConnectionStore(data,pcVar9);
                CVar8 = setup_range(data);
                if (CVar8 == CURLE_OK) {
                  CVar8 = CURLE_OK;
                  Curl_setup_transfer(pcVar9,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
                }
                else {
                  (*pcVar9->handler->done)(pcVar9,CVar8,false);
                }
              }
              goto LAB_0011da6b;
            }
            if (((pcVar9->given->flags & 1) != 0) && ((pcVar9->bits).httpproxy == true)) {
              (pcVar9->bits).tunnel_proxy = true;
            }
            CVar8 = parse_remote_port(data,pcVar9);
            if (CVar8 == CURLE_OK) {
              override_userpass(data,pcVar9,local_138,local_238);
              CVar8 = set_userpass(pcVar9,local_138,local_238);
              if (CVar8 == CURLE_OK) {
                pcVar10 = (data->set).str[0x15];
                (data->set).ssl.CApath = (data->set).str[0x14];
                (data->set).ssl.CAfile = pcVar10;
                pcVar10 = (data->set).str[0x1b];
                (data->set).ssl.CRLfile = (data->set).str[0x1a];
                (data->set).ssl.issuercert = pcVar10;
                auVar1 = *(undefined1 (*) [16])((data->set).str + 0x17);
                auVar23._0_8_ = auVar1._8_8_;
                auVar23._8_4_ = auVar1._0_4_;
                auVar23._12_4_ = auVar1._4_4_;
                (data->set).ssl.random_file = (char *)auVar23._0_8_;
                (data->set).ssl.egdsocket = (char *)auVar23._8_8_;
                (data->set).ssl.cipher_list = (data->set).str[0x16];
                _Var22 = Curl_clone_ssl_config(&(data->set).ssl,&pcVar9->ssl_config);
                CVar8 = CVar18;
                if (_Var22) {
                  if ((((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)
                      ) || (_Var22 = ConnectionExists(data,pcVar9,&local_260), pcVar5 = local_260,
                           !_Var22)) {
                    ConnectionStore(data,pcVar9);
                  }
                  else {
                    reuse_conn(pcVar9,local_260);
                    (*Curl_cfree)(pcVar9);
                    *in_connect = pcVar5;
                    pcVar10 = (pcVar5->host).name;
                    (pcVar5->host).dispname = pcVar10;
                    do {
                      cVar6 = *pcVar10;
                      pcVar10 = pcVar10 + 1;
                    } while ('\0' < cVar6);
                    if (cVar6 != '\0') {
                      Curl_infof(data,"IDN support not present, can\'t parse Unicode domains\n");
                    }
                    Curl_infof(data,"Re-using existing connection! (#%ld) with host %s\n",
                               pcVar5->connectindex,
                               *(undefined8 *)
                                (pcVar5->primary_ip +
                                (ulong)((pcVar5->proxy).name != (char *)0x0) * 0x20 + -0x32));
                    pcVar9 = pcVar5;
                  }
                  do_init(pcVar9);
                  CVar8 = setup_range(data);
                  if (CVar8 == CURLE_OK) {
                    pcVar9->fread_func = (data->set).fread_func;
                    pcVar9->fread_in = (data->set).in;
                    pcVar9->seek_func = (data->set).seek_func;
                    pcVar9->seek_client = (data->set).seek_client;
                    CVar8 = resolve_server(data,pcVar9,asyncp);
LAB_0011da6b:
                    if (CVar8 == CURLE_OK) {
                      pcVar9 = *in_connect;
                      if ((pcVar9->send_pipe->size != 0) || (pcVar9->recv_pipe->size != 0)) {
                        *protocol_done = true;
                        return CURLE_OK;
                      }
                      if (*asyncp != false) {
                        return CURLE_OK;
                      }
                      CVar8 = Curl_setup_conn(pcVar9,protocol_done);
                      if (CVar8 == CURLE_OK) {
                        return CURLE_OK;
                      }
                    }
                  }
                }
              }
            }
            goto LAB_0011d302;
          }
          break;
        }
        pCVar19 = *ppCVar20;
      } while (pCVar19 != (Curl_handler *)0x0);
      Curl_failf(data,"Protocol %s not supported or disabled in libcurl",local_288);
      CVar8 = CURLE_UNSUPPORTED_PROTOCOL;
      goto LAB_0011d302;
    }
  }
  else {
    pcVar10 = (char *)(*Curl_ccalloc)(0x4000,1);
    pcVar9->master_buffer = pcVar10;
    if (pcVar10 != (char *)0x0) goto LAB_0011cebd;
  }
LAB_0011cf2d:
  Curl_llist_destroy(pcVar9->send_pipe,(void *)0x0);
  Curl_llist_destroy(pcVar9->recv_pipe,(void *)0x0);
  Curl_llist_destroy(pcVar9->pend_pipe,(void *)0x0);
  Curl_llist_destroy(pcVar9->done_pipe,(void *)0x0);
  pcVar9->pend_pipe = (curl_llist *)0x0;
  pcVar9->done_pipe = (curl_llist *)0x0;
  pcVar9->send_pipe = (curl_llist *)0x0;
  pcVar9->recv_pipe = (curl_llist *)0x0;
  if (pcVar9->master_buffer != (char *)0x0) {
    (*Curl_cfree)(pcVar9->master_buffer);
    pcVar9->master_buffer = (char *)0x0;
  }
  if (pcVar9->localdev != (char *)0x0) {
    (*Curl_cfree)(pcVar9->localdev);
    pcVar9->localdev = (char *)0x0;
  }
  (*Curl_cfree)(pcVar9);
LAB_0011d302:
  if (*in_connect != (connectdata *)0x0) {
    Curl_disconnect(*in_connect,false);
    *in_connect = (connectdata *)0x0;
  }
  return CVar8;
}

Assistant:

CURLcode Curl_connect(struct SessionHandle *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode code;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  code = create_conn(data, in_connect, asyncp);

  if(CURLE_OK == code) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      code = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(code && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return code;
}